

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

void __thiscall QAuthenticatorPrivate::QAuthenticatorPrivate(QAuthenticatorPrivate *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  QRandomGenerator *this_00;
  quint64 qVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QArrayDataPointer<char> QStack_78;
  QArrayDataPointer<char> local_60;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->password).d.size = 0;
  (this->options).d = (Data *)0x0;
  (this->password).d.d = (Data *)0x0;
  (this->password).d.ptr = (char16_t *)0x0;
  (this->extractedUser).d.ptr = (char16_t *)0x0;
  (this->extractedUser).d.size = 0;
  (this->user).d.size = 0;
  (this->extractedUser).d.d = (Data *)0x0;
  (this->user).d.d = (Data *)0x0;
  (this->user).d.ptr = (char16_t *)0x0;
  this->method = None;
  (this->realm).d.d = (Data *)0x0;
  (this->realm).d.ptr = (char16_t *)0x0;
  (this->realm).d.size = 0;
  (this->challenge).d.d = (Data *)0x0;
  (this->challenge).d.ptr = (char *)0x0;
  (this->challenge).d.size = 0;
  *(undefined8 *)((long)&(this->challenge).d.size + 1) = 0;
  *(undefined8 *)((long)&(this->gssApiHandles).d + 1) = 0;
  *(undefined8 *)&this->phase = 0;
  *(undefined8 *)((long)&(this->cnonce).d.d + 4) = 0;
  *(undefined8 *)((long)&(this->cnonce).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->cnonce).d.size + 4) = 0;
  (this->workstation).d.d = (Data *)0x0;
  (this->workstation).d.ptr = (char16_t *)0x0;
  (this->workstation).d.size = 0;
  (this->userDomain).d.d = (Data *)0x0;
  (this->userDomain).d.ptr = (char16_t *)0x0;
  (this->userDomain).d.size = 0;
  this_00 = (QRandomGenerator *)QRandomGenerator64::system();
  qVar4 = QRandomGenerator::generate64(this_00);
  QByteArray::number((ulonglong)&QStack_78,(int)qVar4);
  QVar5.m_data = (storage_type *)QStack_78.size;
  QVar5.m_size = (qsizetype)&local_60;
  QCryptographicHash::hash(QVar5,(Algorithm)QStack_78.ptr);
  QByteArray::toHex((char)&local_48);
  pDVar2 = (this->cnonce).d.d;
  pcVar3 = (this->cnonce).d.ptr;
  (this->cnonce).d.d = local_48.d;
  (this->cnonce).d.ptr = local_48.ptr;
  qVar1 = (this->cnonce).d.size;
  (this->cnonce).d.size = local_48.size;
  local_48.d = pDVar2;
  local_48.ptr = pcVar3;
  local_48.size = qVar1;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_78);
  this->nonceCount = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAuthenticatorPrivate::QAuthenticatorPrivate()
    : method(None)
    , hasFailed(false)
    , phase(Start)
    , nonceCount(0)
{
    cnonce = QCryptographicHash::hash(QByteArray::number(QRandomGenerator::system()->generate64(), 16),
                                      QCryptographicHash::Md5).toHex();
    nonceCount = 0;
}